

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseBinaryLiteral(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                   *this)

{
  byte bVar1;
  UnicodeChar UVar2;
  char *pcVar3;
  byte unaff_R13B;
  UTF8Reader UVar4;
  bool bVar5;
  bool bVar6;
  UTF8Reader t;
  UTF8Reader local_40;
  UTF8Reader local_38;
  
  UVar4.data = (this->input).data;
  pcVar3 = "0b";
  local_40.data = UVar4.data;
  do {
    bVar1 = *pcVar3;
    if (bVar1 == 0) {
      unaff_R13B = 1;
      bVar5 = false;
      UVar4.data = local_40.data;
    }
    else {
      UVar2 = UTF8Reader::getAndAdvance(&local_40);
      bVar5 = UVar2 == bVar1;
      unaff_R13B = unaff_R13B & bVar5;
    }
    pcVar3 = (char *)((byte *)pcVar3 + 1);
  } while (bVar5);
  bVar5 = true;
  if (unaff_R13B == 0) {
    pcVar3 = "0B";
    local_40.data = UVar4.data;
    do {
      bVar1 = *pcVar3;
      if (bVar1 == 0) {
        bVar5 = true;
        bVar6 = false;
        UVar4.data = local_40.data;
      }
      else {
        UVar2 = UTF8Reader::getAndAdvance(&local_40);
        bVar6 = UVar2 == bVar1;
        bVar5 = (bool)(bVar5 & bVar6);
      }
      pcVar3 = (char *)((byte *)pcVar3 + 1);
    } while (bVar6);
  }
  if (bVar5) {
    local_38.data = UVar4.data;
    bVar5 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::
            parseIntegerWithBase<2,soul::Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::parseBinaryLiteral()::_lambda(unsigned_int)_1_>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,&local_38,(anon_class_1_0_00000001 *)&local_40);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool parseBinaryLiteral()
    {
        auto t = input;

        if (t.advanceIfStartsWith ("0b", "0B"))
            return parseIntegerWithBase<2> (t, [] (UnicodeChar c) -> int { return c == '0' ? 0 : (c == '1' ? 1 : -1); });

        return false;
    }